

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule.hpp
# Opt level: O2

rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>
* __thiscall
boost::spirit::classic::
rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>
::operator=(rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>
            *this,alternative<_55c93892_> *p)

{
  long *plVar1;
  second_type prVar2;
  second_type prVar3;
  second_type prVar4;
  second_type prVar5;
  second_type prVar6;
  second_type prVar7;
  second_type prVar8;
  undefined8 *puVar9;
  
  puVar9 = (undefined8 *)operator_new(0x40);
  *puVar9 = &PTR__abstract_parser_00605078;
  prVar2 = *(second_type *)
            ((long)&(p->super_binary<_118896e8_>).subj.super_compressed_pair_imp<_c8d6696b_>.first_.
                    super_binary<_6b04dde8_>.subj.super_compressed_pair_imp<_8021f1ef_> + 8);
  prVar3 = *(second_type *)
            ((long)&(p->super_binary<_118896e8_>).subj.super_compressed_pair_imp<_c8d6696b_>.first_.
                    super_binary<_6b04dde8_>.subj.super_compressed_pair_imp<_8021f1ef_> + 0x10);
  prVar4 = *(second_type *)
            ((long)&(p->super_binary<_118896e8_>).subj.super_compressed_pair_imp<_c8d6696b_>.first_.
                    super_binary<_6b04dde8_>.subj.super_compressed_pair_imp<_8021f1ef_> + 0x18);
  prVar5 = *(second_type *)
            ((long)&(p->super_binary<_118896e8_>).subj.super_compressed_pair_imp<_c8d6696b_>.first_.
                    super_binary<_6b04dde8_>.subj.super_compressed_pair_imp<_8021f1ef_> + 0x18);
  prVar6 = *(second_type *)
            ((long)&(p->super_binary<_118896e8_>).subj.super_compressed_pair_imp<_c8d6696b_>.first_.
                    super_binary<_6b04dde8_>.subj.super_compressed_pair_imp<_8021f1ef_> + 0x20);
  prVar7 = *(second_type *)
            ((long)&(p->super_binary<_118896e8_>).subj.super_compressed_pair_imp<_c8d6696b_>.first_.
                    super_binary<_6b04dde8_>.subj.super_compressed_pair_imp<_8021f1ef_> + 0x28);
  prVar8 = (p->super_binary<_118896e8_>).subj.super_compressed_pair_imp<_c8d6696b_>.second_;
  puVar9[1] = *(undefined8 *)
               &(p->super_binary<_118896e8_>).subj.super_compressed_pair_imp<_c8d6696b_>.first_.
                super_binary<_6b04dde8_>.subj.super_compressed_pair_imp<_8021f1ef_>;
  puVar9[2] = prVar2;
  puVar9[3] = prVar3;
  puVar9[4] = prVar4;
  puVar9[4] = prVar5;
  puVar9[5] = prVar6;
  puVar9[6] = prVar7;
  puVar9[7] = prVar8;
  plVar1 = *(long **)this;
  *(undefined8 **)this = puVar9;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  return (rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cobp::CommentOrBlankParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>,_boost::spirit::classic::nil_t,_boost::spirit::classic::nil_t>
          *)this;
}

Assistant:

rule& operator=(ParserT const& p)
        {
            ptr.reset(new impl::concrete_parser<ParserT, scanner_t, attr_t>(p));
            return *this;
        }